

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O1

void sn76496_w_maxim(SN76489_Context *chip,UINT8 reg,UINT8 data)

{
  byte bVar1;
  ulong uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  
  iVar5 = (int)CONCAT71(in_register_00000031,reg);
  if (iVar5 == 1) {
    chip->PSGStereo = data;
    return;
  }
  if (iVar5 != 0) {
    return;
  }
  if ((char)data < '\0') {
    bVar1 = data >> 4 & 7;
    chip->LatchedRegister = bVar1;
    uVar2 = (ulong)bVar1;
    uVar3 = chip->Registers[uVar2] & 0x3f0;
    uVar4 = (ushort)(data & 0xf);
  }
  else {
    uVar2 = (ulong)chip->LatchedRegister;
    if ((chip->LatchedRegister & 1) != 0 || 4 < uVar2) {
      chip->Registers[uVar2] = (ushort)(data & 0xf);
      goto LAB_00127490;
    }
    uVar3 = chip->Registers[uVar2] & 0xf;
    uVar4 = (data & 0x3f) << 4;
  }
  chip->Registers[uVar2] = uVar4 | uVar3;
LAB_00127490:
  uVar2 = (ulong)chip->LatchedRegister;
  switch(uVar2) {
  case 0:
  case 2:
  case 4:
    if (chip->Registers[uVar2] == 0) {
      chip->Registers[uVar2] = 1;
      return;
    }
    break;
  case 6:
    chip->NoiseShiftRegister = 0x8000;
    chip->NoiseFreq = (UINT16)(0x10 << ((byte)chip->Registers[6] & 3));
    return;
  }
  return;
}

Assistant:

static void sn76496_w_maxim(SN76489_Context* chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		SN76489_Write(chip, data);
		break;
	case SN76496_W_GGST:
		SN76489_GGStereoWrite(chip, data);
		break;
	}
	return;
}